

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical<long>(Omega_h *this,Int deg,Read<int> *ev2v)

{
  char *file;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<long> local_f8;
  Read<long> local_e8;
  undefined4 local_d4;
  Read<long> local_d0;
  __cxx11 local_c0 [55];
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  ScopedTimer local_21;
  Read<int> *pRStack_20;
  ScopedTimer omega_h_scoped_function_timer;
  Read<int> *ev2v_local;
  Int deg_local;
  
  pRStack_20 = ev2v;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_89);
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::to_string(local_c0,99);
  std::operator+(local_48,local_68);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_21,"get_codes_to_canonical",file);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if (deg == 4) {
    Read<long>::Read(&local_d0,ev2v);
    get_codes_to_canonical_deg<4,long>(this,(Read<int> *)&local_d0);
    Read<long>::~Read(&local_d0);
  }
  else if (deg == 3) {
    Read<long>::Read(&local_e8,ev2v);
    get_codes_to_canonical_deg<3,long>(this,(Read<int> *)&local_e8);
    Read<long>::~Read(&local_e8);
  }
  else {
    if (deg != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
           ,0x67);
    }
    Read<long>::Read(&local_f8,ev2v);
    get_codes_to_canonical_deg<2,long>(this,(Read<int> *)&local_f8);
    Read<long>::~Read(&local_f8);
  }
  local_d4 = 1;
  ScopedTimer::~ScopedTimer(&local_21);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> get_codes_to_canonical(Int const deg, Read<T> const ev2v) {
  OMEGA_H_TIME_FUNCTION;
  if (deg == 4) return get_codes_to_canonical_deg<4>(ev2v);
  if (deg == 3) return get_codes_to_canonical_deg<3>(ev2v);
  if (deg == 2) return get_codes_to_canonical_deg<2>(ev2v);
  OMEGA_H_NORETURN(Read<I8>());
}